

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringUtils.cpp
# Opt level: O0

int OpenMD::isEndLine(char *line)

{
  int iVar1;
  char *__s;
  char *__s1;
  char *in_RDI;
  char *foo;
  char *working_line;
  int local_4;
  
  __s = strdup(in_RDI);
  __s1 = strtok(__s," ,;\t");
  if ((__s1 == (char *)0x0) || (iVar1 = strcasecmp(__s1,"end"), iVar1 != 0)) {
    free(__s);
    local_4 = 0;
  }
  else {
    free(__s);
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int isEndLine(char* line) {
    char* working_line;
    char* foo;

    working_line = strdup(line);

    foo = strtok(working_line, " ,;\t");

    if (foo != NULL) {
      if (!strcasecmp(foo, "end")) {
        free(working_line);
        return 1;
      }
    }

    free(working_line);
    return 0;
  }